

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

Frame * __thiscall Frame::reset(Frame *this,size_t newSize)

{
  uchar *__p;
  pointer puVar1;
  stringstream stream;
  bad_alloc *anon_var_0;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_20;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> tmp;
  size_t newSize_local;
  Frame *this_local;
  
  tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)newSize;
  if (this->m_OriginalSize < newSize) {
    __p = (uchar *)operator_new__(newSize);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&local_20,__p);
    this->m_OriginalSize =
         (size_t)tmp._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (&this->m_Data,&local_20);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_20);
  }
  this->m_Size = this->m_OriginalSize;
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->m_Data);
  this->m_Pos = puVar1 + this->m_Size;
  return this;
}

Assistant:

Frame& Frame::reset(const size_t newSize)
{
    if (newSize > m_OriginalSize) {
        try {
            std::unique_ptr<uint8_t[]> tmp {new uint8_t[newSize]};
            m_OriginalSize = newSize;
            m_Data = std::move(tmp);
        } catch (const std::bad_alloc&) {
            LOG_WARN("Not enough memory to reset frame to " << std::dec << newSize << " bytes");
        }
    }

    m_Size = m_OriginalSize;
    m_Pos = m_Data.get() + m_Size;
    return *this;
}